

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main_sqrtAddcbrt(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  double local_120;
  allocator_type local_112;
  allocator_type local_111;
  double local_110;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> data;
  double local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  FC_BPNN bp;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  FC_BPNN::FC_BPNN(&bp,2,6,7,1);
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd010624dd2f1aa;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&data,(double *)&output);
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f9c0ebedfa43fe6;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&data,(double *)&output);
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_120 = 0.0;
  local_110 = 0.0;
  for (iVar4 = 1; iVar4 != 0x3e9; iVar4 = iVar4 + 1) {
    iVar1 = rand();
    iVar2 = rand();
    auVar7._0_8_ = (double)(iVar1 % 1000);
    auVar7._8_8_ = (double)(iVar2 % 1000);
    local_c8 = divpd(auVar7,_DAT_00105100);
    __l._M_len = 2;
    __l._M_array = (iterator)local_b8;
    local_b8 = local_c8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,__l,&local_111);
    local_d0 = square_root_add_cube_root((double)local_c8._0_8_,(double)local_c8._8_8_);
    __l_00._M_len = 1;
    __l_00._M_array = &local_d0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_60,__l_00,&local_112);
    dVar5 = FC_BPNN::train_once(&bp,(vector<double,_std::allocator<double>_> *)&local_48,
                                (vector<double,_std::allocator<double>_> *)&local_60);
    local_120 = local_120 + dVar5;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    if ((ushort)((ushort)iVar4 % 100) == 0) {
      dVar5 = local_120 / 100.0;
      poVar3 = std::operator<<((ostream *)&std::cout,"iter: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
      std::operator<<(poVar3," cost: ");
      poVar3 = std::ostream::_M_insert<double>(dVar5);
      std::operator<<(poVar3," step: ");
      dVar6 = FC_BPNN::getLearningStep(&bp);
      poVar3 = std::ostream::_M_insert<double>(dVar6);
      std::endl<char,std::char_traits<char>>(poVar3);
      if ((local_110 - dVar5) / local_110 <= 0.1) {
        dVar6 = FC_BPNN::getLearningStep(&bp);
        FC_BPNN::setLearningStep(&bp,dVar6 * 0.5);
        local_120 = 0.0;
        local_110 = dVar5;
      }
      else {
        local_120 = 0.0;
        local_110 = dVar5;
      }
    }
  }
  FC_BPNN::predict(&bp,&data,&output);
  std::operator<<((ostream *)&std::cout,"prediction: ");
  poVar3 = std::ostream::_M_insert<double>
                     (*output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar3," gt: ");
  dVar5 = square_root_add_cube_root
                    (*data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                     data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[1]);
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  FC_BPNN::~FC_BPNN(&bp);
  return 1;
}

Assistant:

int main_sqrtAddcbrt() {
	FC_BPNN bp(2, 6, 7, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.0274);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 1000; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b }, { square_root_add_cube_root(a,b) });
		if (i % 100 == 0) {
			cost /= 100;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			double costRate = (lastCost - cost) / lastCost;
			if (costRate <= 0.1) {
				bp.setLearningStep(bp.getLearningStep() / 2);
			}
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << square_root_add_cube_root(data[0], data[1]) << std::endl;
	return 1;
}